

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool adios2sys::SystemTools::FileExists(char *filename)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  if (filename == (char *)0x0) {
    bVar3 = false;
  }
  else {
    local_38 = local_28;
    sVar2 = strlen(filename);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,filename,filename + sVar2);
    if (local_30 == 0) {
      bVar3 = false;
    }
    else {
      iVar1 = access(local_38,4);
      bVar3 = iVar1 == 0;
    }
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  return bVar3;
}

Assistant:

bool SystemTools::FileExists(const char* filename)
{
  if (!filename) {
    return false;
  }
  return SystemTools::FileExists(std::string(filename));
}